

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

undefined8 __thiscall indigox::Molecule::GetFormula_abi_cxx11_(Molecule *this)

{
  mapped_type mVar1;
  uint uVar2;
  bool bVar3;
  mapped_type *pmVar4;
  key_type *__k;
  reference ppVar5;
  long in_RSI;
  undefined8 in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *e;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range1_1;
  stringstream ss;
  Element_p elem;
  Atom_p atm;
  const_iterator __end1;
  const_iterator __begin1;
  MolAtoms *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  e_count;
  undefined6 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  key_type *in_stack_fffffffffffffc08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffffc10;
  allocator *this_00;
  _Self local_360;
  _Self local_358;
  undefined1 *local_350;
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  stringstream local_258 [16];
  ostream local_248 [376];
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  __shared_ptr local_78 [32];
  shared_ptr<indigox::Atom> *local_58;
  __normal_iterator<const_std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
  local_50;
  long local_48;
  undefined1 local_40 [64];
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)0x110217);
  local_48 = in_RSI + 0x40;
  local_50._M_current =
       (shared_ptr<indigox::Atom> *)
       std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
       ::begin((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                *)CONCAT17(in_stack_fffffffffffffbcf,
                           CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)));
  local_58 = (shared_ptr<indigox::Atom> *)
             std::
             vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
             ::end((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                    *)CONCAT17(in_stack_fffffffffffffbcf,
                               CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)));
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                             *)in_stack_fffffffffffffbd0,
                            (__normal_iterator<const_std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbcf,
                                        CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8
                                                ))), bVar3) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
    ::operator*(&local_50);
    std::shared_ptr<indigox::Atom>::shared_ptr
              ((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffbd0,
               (shared_ptr<indigox::Atom> *)
               CONCAT17(in_stack_fffffffffffffbcf,
                        CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)));
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1102a5);
    Atom::GetElement((Atom *)CONCAT17(in_stack_fffffffffffffbcf,
                                      CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8))
                    );
    bVar3 = std::__shared_ptr::operator_cast_to_bool(local_78);
    if (bVar3) {
      std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1103bb);
      Element::GetSymbol_abi_cxx11_
                ((Element *)
                 CONCAT17(in_stack_fffffffffffffbcf,
                          CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      *pmVar4 = *pmVar4 + 1;
      std::__cxx11::string::~string(local_d0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Xx",&local_a9);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      *pmVar4 = *pmVar4 + 1;
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x110450);
    std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x11045d);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
    ::operator++(&local_50);
  }
  std::__cxx11::stringstream::stringstream(local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"C",&local_279);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  mVar1 = *pmVar4;
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  if (mVar1 != 0) {
    std::operator<<(local_248,"C");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"C",&local_2a1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  uVar2 = *pmVar4;
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  if (1 < uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"C",&local_2c9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    std::ostream::operator<<(local_248,*pmVar4);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  }
  this_00 = &local_2f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"H",this_00);
  __k = (key_type *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)this_00,in_stack_fffffffffffffc08);
  mVar1 = *(mapped_type *)__k;
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  if (mVar1 != 0) {
    std::operator<<(local_248,"H");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"H",&local_319);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)this_00,__k);
  uVar2 = *pmVar4;
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  if (1 < uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,"H",&local_341);
    in_stack_fffffffffffffbd0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)this_00,__k);
    std::ostream::operator<<(local_248,*(uint *)in_stack_fffffffffffffbd0);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
  }
  local_350 = local_40;
  local_358._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)CONCAT17(in_stack_fffffffffffffbcf,
                           CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)));
  local_360._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)CONCAT17(in_stack_fffffffffffffbcf,
                         CONCAT16(in_stack_fffffffffffffbce,in_stack_fffffffffffffbc8)));
  while (bVar3 = std::operator!=(&local_358,&local_360), bVar3) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                          *)0x110a24);
    in_stack_fffffffffffffbcf =
         std::operator!=(in_stack_fffffffffffffbd0,
                         (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                          CONCAT16(in_stack_fffffffffffffbce,
                                                   in_stack_fffffffffffffbc8)));
    if ((((bool)in_stack_fffffffffffffbcf) &&
        (in_stack_fffffffffffffbce =
              std::operator!=(in_stack_fffffffffffffbd0,
                              (char *)CONCAT17(in_stack_fffffffffffffbcf,
                                               CONCAT16(in_stack_fffffffffffffbce,
                                                        in_stack_fffffffffffffbc8))),
        (bool)in_stack_fffffffffffffbce)) &&
       (std::operator<<(local_248,(string *)ppVar5), 1 < ppVar5->second)) {
      std::ostream::operator<<(local_248,ppVar5->second);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                  *)in_stack_fffffffffffffbd0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_258);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)0x110afc);
  return in_RDI;
}

Assistant:

String Molecule::GetFormula() const {
  std::map<String, Uint> e_count;
  for (Atom_p atm : atoms_) {
    Element_p elem = atm->GetElement();
    if (!elem) e_count["Xx"]++;
    else e_count[elem->GetSymbol()]++;
  }
  
  std::stringstream ss;
  if (e_count["C"]) ss << "C";
  if (e_count["C"] > 1) ss << e_count["C"];
  if (e_count["H"]) ss << "H";
  if (e_count["H"] > 1) ss << e_count["H"];
  for (auto& e : e_count) {
    if (e.first != "C" && e.first != "H") {
      ss << e.first;
      if (e.second > 1) ss << e.second;
    }
  }
  return ss.str();
}